

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddBezierCurve
          (ImDrawList *this,ImVec2 *pos0,ImVec2 *cp0,ImVec2 *cp1,ImVec2 *pos1,ImU32 col,
          float thickness,int num_segments)

{
  float thickness_local;
  ImU32 col_local;
  ImVec2 *pos1_local;
  ImVec2 *cp1_local;
  ImVec2 *cp0_local;
  ImVec2 *pos0_local;
  ImDrawList *this_local;
  
  if (col >> 0x18 != 0) {
    PathLineTo(this,pos0);
    PathBezierCurveTo(this,cp0,cp1,pos1,num_segments);
    PathStroke(this,col,false,thickness);
  }
  return;
}

Assistant:

void ImDrawList::AddBezierCurve(const ImVec2& pos0, const ImVec2& cp0, const ImVec2& cp1, const ImVec2& pos1, ImU32 col, float thickness, int num_segments)
{
    if ((col >> 24) == 0)
        return;

    PathLineTo(pos0);
    PathBezierCurveTo(cp0, cp1, pos1, num_segments);
    PathStroke(col, false, thickness);
}